

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

HTMLElement * __thiscall choc::html::HTMLElement::setClass(HTMLElement *this,string_view value)

{
  HTMLElement *pHVar1;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"class",&local_41);
  pHVar1 = setProperty(this,&local_40,value);
  std::__cxx11::string::~string((string *)&local_40);
  return pHVar1;
}

Assistant:

HTMLElement& setClass (std::string_view value)      { return setProperty ("class", std::move (value)); }